

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t zip_read_mac_metadata(archive_read *a,archive_entry *entry,zip_entry *rsrc)

{
  char cVar1;
  archive_entry *a_00;
  uint uVar2;
  char *pcVar3;
  size_t sStack_80;
  wchar_t r;
  size_t bytes_used;
  ssize_t bytes_avail;
  uchar *p;
  wchar_t eof;
  wchar_t ret;
  ssize_t hsize;
  size_t metadata_bytes;
  size_t remaining_bytes;
  int64_t offset;
  uchar *mp;
  uchar *metadata;
  zip *zip;
  zip_entry *rsrc_local;
  archive_entry *entry_local;
  archive_read *a_local;
  
  metadata = (uchar *)a->format->data;
  zip = (zip *)rsrc;
  rsrc_local = (zip_entry *)entry;
  entry_local = (archive_entry *)a;
  remaining_bytes = archive_filter_bytes(&a->archive,0);
  a_00 = entry_local;
  p._4_4_ = L'\0';
  if ((zip->entry_uncompressed_bytes_read & 0xf7) == 0) {
    if (*(long *)&zip->has_encrypted_entries < 0x400001) {
      mp = (uchar *)malloc(*(size_t *)&zip->has_encrypted_entries);
      if (mp == (uchar *)0x0) {
        archive_set_error((archive *)entry_local,0xc,"Can\'t allocate memory for Mac metadata");
        a_local._4_4_ = L'\xffffffe2';
      }
      else {
        if ((long)remaining_bytes < (long)zip->central_directory_entries_total) {
          __archive_read_consume
                    ((archive_read *)entry_local,
                     zip->central_directory_entries_total - remaining_bytes);
        }
        else if (remaining_bytes != zip->central_directory_entries_total) {
          __archive_read_seek((archive_read *)entry_local,zip->central_directory_entries_total,0);
        }
        _eof = zip_get_local_file_header_size((archive_read *)entry_local,0);
        __archive_read_consume((archive_read *)entry_local,_eof);
        metadata_bytes = zip->central_directory_entries_on_this_disk;
        hsize = *(ssize_t *)&zip->has_encrypted_entries;
        offset = (int64_t)mp;
        p._0_4_ = 0;
        for (; (int)p == 0 && metadata_bytes != 0; metadata_bytes = metadata_bytes - sStack_80) {
          bytes_avail = (ssize_t)__archive_read_ahead
                                           ((archive_read *)entry_local,1,(ssize_t *)&bytes_used);
          if ((void *)bytes_avail == (void *)0x0) {
            archive_set_error((archive *)entry_local,0x54,"Truncated ZIP file header");
            p._4_4_ = L'\xffffffec';
            goto LAB_008873de;
          }
          if (metadata_bytes < bytes_used) {
            bytes_used = metadata_bytes;
          }
          cVar1 = (char)zip->entry_uncompressed_bytes_read;
          if (cVar1 == '\0') {
            memcpy((void *)offset,(void *)bytes_avail,bytes_used);
            sStack_80 = bytes_used;
            hsize = hsize - bytes_used;
            offset = bytes_used + offset;
            if (hsize == 0) {
              p._0_4_ = 1;
            }
          }
          else if (cVar1 == '\b') {
            p._4_4_ = zip_deflate_init((archive_read *)entry_local,(zip *)metadata);
            if (p._4_4_ != L'\0') goto LAB_008873de;
            *(ssize_t *)(metadata + 0xb0) = bytes_avail;
            *(undefined4 *)(metadata + 0xb8) = (undefined4)bytes_used;
            metadata[0xc0] = '\0';
            metadata[0xc1] = '\0';
            metadata[0xc2] = '\0';
            metadata[0xc3] = '\0';
            metadata[0xc4] = '\0';
            metadata[0xc5] = '\0';
            metadata[0xc6] = '\0';
            metadata[199] = '\0';
            *(int64_t *)(metadata + 200) = offset;
            *(undefined4 *)(metadata + 0xd0) = (undefined4)hsize;
            metadata[0xd8] = '\0';
            metadata[0xd9] = '\0';
            metadata[0xda] = '\0';
            metadata[0xdb] = '\0';
            metadata[0xdc] = '\0';
            metadata[0xdd] = '\0';
            metadata[0xde] = '\0';
            metadata[0xdf] = '\0';
            uVar2 = cm_zlib_inflate((z_streamp_conflict)(metadata + 0xb0),0);
            if (uVar2 == 0xfffffffc) {
              archive_set_error((archive *)entry_local,0xc,"Out of memory for ZIP decompression");
              p._4_4_ = L'\xffffffe2';
              goto LAB_008873de;
            }
            if (uVar2 != 0) {
              if (uVar2 != 1) {
                archive_set_error((archive *)entry_local,-1,"ZIP decompression failed (%d)",
                                  (ulong)uVar2);
                p._4_4_ = L'\xffffffe2';
                goto LAB_008873de;
              }
              p._0_4_ = 1;
            }
            sStack_80 = *(size_t *)(metadata + 0xc0);
            hsize = hsize - *(long *)(metadata + 0xd8);
            offset = *(long *)(metadata + 0xd8) + offset;
          }
          else {
            sStack_80 = 0;
          }
          __archive_read_consume((archive_read *)entry_local,sStack_80);
        }
        archive_entry_copy_mac_metadata
                  ((archive_entry *)rsrc_local,mp,*(long *)&zip->has_encrypted_entries - hsize);
LAB_008873de:
        __archive_read_seek((archive_read *)entry_local,remaining_bytes,0);
        metadata[0x99] = '\0';
        free(mp);
        a_local._4_4_ = p._4_4_;
      }
    }
    else {
      archive_set_error((archive *)entry_local,0x54,"Mac metadata is too large: %jd > 4M bytes",
                        *(undefined8 *)&zip->has_encrypted_entries);
      a_local._4_4_ = L'\xffffffec';
    }
  }
  else {
    pcVar3 = compression_name((uint)(byte)zip->entry_uncompressed_bytes_read);
    archive_set_error((archive *)a_00,0x54,"Unsupported ZIP compression method (%s)",pcVar3);
    a_local._4_4_ = L'\xffffffec';
  }
  return a_local._4_4_;
}

Assistant:

static int
zip_read_mac_metadata(struct archive_read *a, struct archive_entry *entry,
    struct zip_entry *rsrc)
{
	struct zip *zip = (struct zip *)a->format->data;
	unsigned char *metadata, *mp;
	int64_t offset = archive_filter_bytes(&a->archive, 0);
	size_t remaining_bytes, metadata_bytes;
	ssize_t hsize;
	int ret = ARCHIVE_OK, eof;

	switch(rsrc->compression) {
	case 0:  /* No compression. */
#ifdef HAVE_ZLIB_H
	case 8: /* Deflate compression. */
#endif
		break;
	default: /* Unsupported compression. */
		/* Return a warning. */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unsupported ZIP compression method (%s)",
		    compression_name(rsrc->compression));
		/* We can't decompress this entry, but we will
		 * be able to skip() it and try the next entry. */
		return (ARCHIVE_WARN);
	}

	if (rsrc->uncompressed_size > (4 * 1024 * 1024)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Mac metadata is too large: %jd > 4M bytes",
		    (intmax_t)rsrc->uncompressed_size);
		return (ARCHIVE_WARN);
	}

	metadata = malloc((size_t)rsrc->uncompressed_size);
	if (metadata == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory for Mac metadata");
		return (ARCHIVE_FATAL);
	}

	if (offset < rsrc->local_header_offset)
		__archive_read_consume(a, rsrc->local_header_offset - offset);
	else if (offset != rsrc->local_header_offset) {
		__archive_read_seek(a, rsrc->local_header_offset, SEEK_SET);
	}

	hsize = zip_get_local_file_header_size(a, 0);
	__archive_read_consume(a, hsize);

	remaining_bytes = (size_t)rsrc->compressed_size;
	metadata_bytes = (size_t)rsrc->uncompressed_size;
	mp = metadata;
	eof = 0;
	while (!eof && remaining_bytes) {
		const unsigned char *p;
		ssize_t bytes_avail;
		size_t bytes_used;

		p = __archive_read_ahead(a, 1, &bytes_avail);
		if (p == NULL) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated ZIP file header");
			ret = ARCHIVE_WARN;
			goto exit_mac_metadata;
		}
		if ((size_t)bytes_avail > remaining_bytes)
			bytes_avail = remaining_bytes;
		switch(rsrc->compression) {
		case 0:  /* No compression. */
			memcpy(mp, p, bytes_avail);
			bytes_used = (size_t)bytes_avail;
			metadata_bytes -= bytes_used;
			mp += bytes_used;
			if (metadata_bytes == 0)
				eof = 1;
			break;
#ifdef HAVE_ZLIB_H
		case 8: /* Deflate compression. */
		{
			int r;

			ret = zip_deflate_init(a, zip);
			if (ret != ARCHIVE_OK)
				goto exit_mac_metadata;
			zip->stream.next_in =
			    (Bytef *)(uintptr_t)(const void *)p;
			zip->stream.avail_in = (uInt)bytes_avail;
			zip->stream.total_in = 0;
			zip->stream.next_out = mp;
			zip->stream.avail_out = (uInt)metadata_bytes;
			zip->stream.total_out = 0;

			r = inflate(&zip->stream, 0);
			switch (r) {
			case Z_OK:
				break;
			case Z_STREAM_END:
				eof = 1;
				break;
			case Z_MEM_ERROR:
				archive_set_error(&a->archive, ENOMEM,
				    "Out of memory for ZIP decompression");
				ret = ARCHIVE_FATAL;
				goto exit_mac_metadata;
			default:
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "ZIP decompression failed (%d)", r);
				ret = ARCHIVE_FATAL;
				goto exit_mac_metadata;
			}
			bytes_used = zip->stream.total_in;
			metadata_bytes -= zip->stream.total_out;
			mp += zip->stream.total_out;
			break;
		}
#endif
		default:
			bytes_used = 0;
			break;
		}
		__archive_read_consume(a, bytes_used);
		remaining_bytes -= bytes_used;
	}
	archive_entry_copy_mac_metadata(entry, metadata,
	    (size_t)rsrc->uncompressed_size - metadata_bytes);

exit_mac_metadata:
	__archive_read_seek(a, offset, SEEK_SET);
	zip->decompress_init = 0;
	free(metadata);
	return (ret);
}